

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  UnitTest *this;
  time_t t;
  aiLogStream logstream;
  int local_24;
  uint local_20 [2];
  aiLogStream local_18;
  
  local_24 = argc;
  testing::InitGoogleTest(&local_24,argv);
  time((time_t *)local_20);
  srand(local_20[0]);
  Assimp::DefaultLogger::create("AssimpLog_Cpp.txt",VERBOSE,9,(IOSystem *)0x0);
  aiEnableVerboseLogging(1);
  local_18 = aiGetPredefinedLogStream(aiDefaultLogStream_FILE,"AssimpLog_C.txt");
  aiAttachLogStream(&local_18);
  this = testing::UnitTest::GetInstance();
  iVar1 = testing::UnitTest::Run(this);
  aiDetachAllLogStreams();
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{
    ::testing::InitGoogleTest(&argc, argv);

    // seed the randomizer with the current system time
    time_t t;time(&t);
    srand((unsigned int)t);

    // ............................................................................

    // create a logger from both CPP
    Assimp::DefaultLogger::create("AssimpLog_Cpp.txt",Assimp::Logger::VERBOSE,
        aiDefaultLogStream_DEBUGGER | aiDefaultLogStream_FILE);

    // .. and C. They should smoothly work together
    aiEnableVerboseLogging(AI_TRUE);
    aiLogStream logstream= aiGetPredefinedLogStream(aiDefaultLogStream_FILE, "AssimpLog_C.txt");
    aiAttachLogStream(&logstream);

    int result = RUN_ALL_TESTS();

    // ............................................................................
    // but shutdown must be done from C to ensure proper deallocation
    aiDetachAllLogStreams();

    return result;
}